

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<capnp::word> *
kj::_::CopyConstructArray_<kj::Array<capnp::word>,_kj::Array<capnp::word>_*,_true,_false>::apply
          (Array<capnp::word> *pos,Array<capnp::word> *start,Array<capnp::word> *end)

{
  for (; start != end; start = start + 1) {
    pos->ptr = start->ptr;
    pos->size_ = start->size_;
    pos->disposer = start->disposer;
    pos = pos + 1;
    start->ptr = (word *)0x0;
    start->size_ = 0;
  }
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }